

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall gl4cts::DirectStateAccess::Textures::BindUnitTest::Check(BindUnitTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLubyte *pGVar4;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  string local_1f8;
  string local_1d8;
  MessageBuilder local_1a8;
  uint local_24;
  long lStack_20;
  GLuint i;
  Functions *gl;
  BindUnitTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  pGVar4 = (GLubyte *)operator_new__(0x18);
  this->m_result = pGVar4;
  (**(code **)(lStack_20 + 0xff0))(0xcf5,1);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1c3e);
  (**(code **)(lStack_20 + 0xff0))(0xd05,1);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1c41);
  (**(code **)(lStack_20 + 0x1220))(0,0,2,3,0x1908,0x1401,this->m_result);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"glDrawArrays call has failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1c45);
  local_24 = 0;
  while( true ) {
    if (0x17 < local_24) {
      return true;
    }
    if (s_texture_data_rgba[local_24] != this->m_result[local_24]) break;
    local_24 = local_24 + 1;
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [18])"Framebuffer data ");
  DataToString_abi_cxx11_(&local_1d8,this,0x18,this->m_result);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1d8);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [38])" does not match the reference values ");
  DataToString_abi_cxx11_(&local_1f8,this,0x18,s_texture_data_rgba);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1f8);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b5e49a);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  return false;
}

Assistant:

bool BindUnitTest::Check()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup storage for results. */
	m_result = new glw::GLubyte[s_texture_count_rgba];

	/* Setup pixel sotre modes.*/
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, sizeof(glw::GLubyte));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	gl.pixelStorei(GL_PACK_ALIGNMENT, sizeof(glw::GLubyte));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	/* Query framebuffer's image. */
	gl.readPixels(0, 0, s_texture_width, s_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, m_result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call has failed.");

	/* Compare values with reference. */
	for (glw::GLuint i = 0; i < s_texture_count_rgba; ++i)
	{
		if (s_texture_data_rgba[i] != m_result[i])
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Framebuffer data " << DataToString(s_texture_count_rgba, m_result)
				<< " does not match the reference values " << DataToString(s_texture_count_rgba, s_texture_data_rgba)
				<< "." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}